

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

String * __thiscall
kj::anon_unknown_30::SocketAddress::toString(String *__return_storage_ptr__,SocketAddress *this)

{
  sa_family_t sVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  ArrayPtr<const_char> *in_RCX;
  char (*in_R8) [2];
  unsigned_short *in_R9;
  ArrayPtr<const_char> local_d8;
  undefined1 local_c8 [8];
  ArrayPtr<const_char> path;
  Fault local_b0;
  Fault f_1;
  char buffer_1 [46];
  uint16_t local_70;
  char local_6d [13];
  Fault local_60;
  Fault f;
  char buffer [46];
  uint local_1c;
  SocketAddress *local_18;
  SocketAddress *this_local;
  
  local_18 = this;
  this_local = (SocketAddress *)__return_storage_ptr__;
  if ((this->wildcard & 1U) == 0) {
    sVar1 = (this->addr).generic.sa_family;
    if (sVar1 == 1) {
      _local_c8 = _::safeUnixPath(&(this->addr).unixDomain,this->addrlen);
      sVar4 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_c8);
      if ((sVar4 != 0) &&
         (pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)local_c8,0),
         *pcVar2 == '\0')) {
        sVar4 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_c8);
        local_d8 = ArrayPtr<const_char>::slice((ArrayPtr<const_char> *)local_c8,1,sVar4);
        str<char_const(&)[15],kj::ArrayPtr<char_const>>
                  (__return_storage_ptr__,(kj *)"unix-abstract:",(char (*) [15])&local_d8,in_RCX);
        return __return_storage_ptr__;
      }
      str<char_const(&)[6],kj::ArrayPtr<char_const>&>
                (__return_storage_ptr__,(kj *)"unix:",(char (*) [6])local_c8,in_RCX);
    }
    else if (sVar1 == 2) {
      pcVar2 = inet_ntop((uint)(this->addr).generic.sa_family,(void *)((long)&this->addr + 4),
                         (char *)&f,0x2e);
      if (pcVar2 == (char *)0x0) {
        piVar3 = __errno_location();
        _::Debug::Fault::Fault
                  (&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x246,*piVar3,"inet_ntop","");
        _::Debug::Fault::~Fault(&local_60);
        heapString(__return_storage_ptr__,"(inet_ntop error)");
      }
      else {
        local_6d[0] = ':';
        local_70 = ntohs((this->addr).inet4.sin_port);
        str<char(&)[46],char,unsigned_short>
                  (__return_storage_ptr__,(kj *)&f,(char (*) [46])local_6d,(char *)&local_70,
                   (unsigned_short *)in_R8);
      }
    }
    else if (sVar1 == 10) {
      pcVar2 = inet_ntop((uint)(this->addr).generic.sa_family,(void *)((long)&this->addr + 8),
                         (char *)&f_1,0x2e);
      if (pcVar2 == (char *)0x0) {
        piVar3 = __errno_location();
        _::Debug::Fault::Fault
                  (&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x24f,*piVar3,"inet_ntop","");
        _::Debug::Fault::~Fault(&local_b0);
        heapString(__return_storage_ptr__,"(inet_ntop error)");
      }
      else {
        path.size_._7_1_ = 0x5b;
        path.size_._4_2_ = ntohs((this->addr).inet4.sin_port);
        str<char,char(&)[46],char_const(&)[3],unsigned_short>
                  (__return_storage_ptr__,(kj *)((long)&path.size_ + 7),(char *)&f_1,
                   (char (*) [46])"]:",(char (*) [3])((long)&path.size_ + 4),in_R9);
      }
    }
    else {
      str<char_const(&)[25],unsigned_short_const&,char_const(&)[2]>
                (__return_storage_ptr__,(kj *)"(unknown address family ",(char (*) [25])&this->addr,
                 (unsigned_short *)0x651092,in_R8);
    }
  }
  else {
    local_1c = getPort(this);
    str<char_const(&)[3],unsigned_int>
              (__return_storage_ptr__,(kj *)"*:",(char (*) [3])&local_1c,(uint *)in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString() const {
    if (wildcard) {
      return str("*:", getPort());
    }

    switch (addr.generic.sa_family) {
      case AF_INET: {
        char buffer[INET6_ADDRSTRLEN];
        if (inet_ntop(addr.inet4.sin_family, &addr.inet4.sin_addr,
                      buffer, sizeof(buffer)) == nullptr) {
          KJ_FAIL_SYSCALL("inet_ntop", errno) { break; }
          return heapString("(inet_ntop error)");
        }
        return str(buffer, ':', ntohs(addr.inet4.sin_port));
      }
      case AF_INET6: {
        char buffer[INET6_ADDRSTRLEN];
        if (inet_ntop(addr.inet6.sin6_family, &addr.inet6.sin6_addr,
                      buffer, sizeof(buffer)) == nullptr) {
          KJ_FAIL_SYSCALL("inet_ntop", errno) { break; }
          return heapString("(inet_ntop error)");
        }
        return str('[', buffer, "]:", ntohs(addr.inet6.sin6_port));
      }
      case AF_UNIX: {
        auto path = _::safeUnixPath(&addr.unixDomain, addrlen);
        if (path.size() > 0 && path[0] == '\0') {
          return str("unix-abstract:", path.slice(1, path.size()));
        } else {
          return str("unix:", path);
        }
      }
      default:
        return str("(unknown address family ", addr.generic.sa_family, ")");
    }
  }